

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseWhole_Test::
~BioparserFastaTest_CompressedParseWhole_Test(BioparserFastaTest_CompressedParseWhole_Test *this)

{
  BioparserFastaTest::~BioparserFastaTest(&this->super_BioparserFastaTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseWhole) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1);
  Check();
}